

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

DebuggerPropertyDisplayInfo * __thiscall
Js::VariableWalkerBase::AllocateNewPropertyDisplayInfo
          (VariableWalkerBase *this,PropertyId propertyId,Var value,bool isConst,bool isInDeadZone)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DebuggerPropertyDisplayInfo *pDVar6;
  uint uVar7;
  
  if (this->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x21f,"(pFrame)","pFrame");
    if (!bVar2) goto LAB_008bd9c8;
    *puVar5 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x220,"(value)","value");
    if (!bVar2) goto LAB_008bd9c8;
    *puVar5 = 0;
  }
  uVar7 = 2;
  if (!isInDeadZone) {
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    uVar7 = 0;
    if (*(Var *)(*(long *)(CONCAT44(extraout_var,iVar3) + 8) + 0x4f8) == value) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x221,
                                  "(isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value))"
                                  ,
                                  "isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value)"
                                 );
      if (!bVar2) {
LAB_008bd9c8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      uVar7 = 0;
    }
  }
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  if (isInDeadZone) {
    iVar4 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    value = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString
                      (*(JavascriptLibrary **)(CONCAT44(extraout_var_01,iVar4) + 8));
  }
  pDVar6 = (DebuggerPropertyDisplayInfo *)
           new<Memory::ArenaAllocator>
                     (0x18,(ArenaAllocator *)CONCAT44(extraout_var_00,iVar3),0x366bee);
  pDVar6->propId = propertyId;
  pDVar6->aVar = value;
  pDVar6->flags = uVar7 | isConst;
  return pDVar6;
}

Assistant:

DebuggerPropertyDisplayInfo* VariableWalkerBase::AllocateNewPropertyDisplayInfo(PropertyId propertyId, Var value, bool isConst, bool isInDeadZone)
    {
        Assert(pFrame);
        Assert(value);
        Assert(isInDeadZone || !pFrame->GetScriptContext()->IsUndeclBlockVar(value));

        DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
        flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
        flags |= isInDeadZone ? DebuggerPropertyDisplayInfoFlags_InDeadZone : 0;

        ArenaAllocator *arena = pFrame->GetArena();

        if (isInDeadZone)
        {
            value = pFrame->GetScriptContext()->GetLibrary()->GetDebuggerDeadZoneBlockVariableString();
        }

        return Anew(arena, DebuggerPropertyDisplayInfo, propertyId, value, flags);
    }